

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall
httplib::ClientImpl::ClientImpl
          (ClientImpl *this,string *host,int port,string *client_cert_path,string *client_key_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  string *psVar6;
  uint uVar7;
  long *plVar8;
  undefined8 *puVar9;
  uint uVar10;
  ulong *puVar11;
  ulong uVar12;
  uint __len;
  uint __val;
  string __str;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string *local_60;
  string *local_58;
  string local_50;
  
  this->_vptr_ClientImpl = (_func_int **)&PTR__ClientImpl_0016e150;
  local_88 = &(this->host_).field_2;
  (this->host_)._M_dataplus._M_p = (pointer)local_88;
  pcVar4 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_,pcVar4,pcVar4 + host->_M_string_length);
  this->port_ = port;
  local_60 = &this->host_;
  adjust_host_string(&local_50,this,host);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_a8 = &local_98;
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_98 = *puVar11;
    lStack_90 = plVar8[3];
  }
  else {
    local_98 = *puVar11;
    local_a8 = (ulong *)*plVar8;
  }
  local_a0 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __val = -port;
  if (0 < port) {
    __val = port;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar7 = 4;
    do {
      __len = uVar7;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_0012f249;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_0012f249;
      }
      if (uVar10 < 10000) goto LAB_0012f249;
      uVar12 = uVar12 / 10000;
      uVar7 = __len + 4;
    } while (99999 < uVar10);
    __len = __len + 1;
  }
LAB_0012f249:
  local_80 = local_70;
  local_58 = client_cert_path;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)__len - (char)(port >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)port >> 0x1f) + (long)local_80),__len,__val);
  psVar6 = local_58;
  uVar12 = 0xf;
  if (local_a8 != &local_98) {
    uVar12 = local_98;
  }
  if (uVar12 < (ulong)(local_78 + local_a0)) {
    uVar12 = 0xf;
    if (local_80 != local_70) {
      uVar12 = local_70[0];
    }
    if ((ulong)(local_78 + local_a0) <= uVar12) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a8);
      goto LAB_0012f2de;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_80);
LAB_0012f2de:
  paVar1 = &(this->host_and_port_).field_2;
  (this->host_and_port_)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar2) {
    uVar5 = puVar9[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->host_and_port_).field_2 + 8) = uVar5;
  }
  else {
    (this->host_and_port_)._M_dataplus._M_p = (pointer)*puVar9;
    (this->host_and_port_).field_2._M_allocated_capacity = *psVar2;
  }
  (this->host_and_port_)._M_string_length = puVar9[1];
  *puVar9 = psVar2;
  puVar9[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->socket_).sock = -1;
  *(undefined8 *)((long)&(this->request_mutex_).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->request_mutex_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->socket_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->socket_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->socket_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->socket_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->socket_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->request_mutex_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  p_Var3 = &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->socket_requests_in_flight_ = 0;
  (this->socket_requests_are_from_thread_)._M_thread = 0;
  this->socket_should_be_closed_when_request_is_done_ = false;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->addr_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header
  ;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->client_cert_path_)._M_dataplus._M_p = (pointer)&(this->client_cert_path_).field_2;
  pcVar4 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->client_cert_path_,pcVar4,pcVar4 + psVar6->_M_string_length);
  (this->client_key_path_)._M_dataplus._M_p = (pointer)&(this->client_key_path_).field_2;
  pcVar4 = (client_key_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->client_key_path_,pcVar4,pcVar4 + client_key_path->_M_string_length);
  this->connection_timeout_sec_ = 300;
  this->connection_timeout_usec_ = 0;
  this->read_timeout_sec_ = 5;
  this->read_timeout_usec_ = 0;
  this->write_timeout_sec_ = 5;
  this->write_timeout_usec_ = 0;
  (this->basic_auth_username_)._M_dataplus._M_p = (pointer)&(this->basic_auth_username_).field_2;
  (this->basic_auth_username_)._M_string_length = 0;
  (this->basic_auth_username_).field_2._M_local_buf[0] = '\0';
  (this->basic_auth_password_)._M_dataplus._M_p = (pointer)&(this->basic_auth_password_).field_2;
  (this->basic_auth_password_)._M_string_length = 0;
  (this->basic_auth_password_).field_2._M_local_buf[0] = '\0';
  (this->bearer_token_auth_token_)._M_dataplus._M_p =
       (pointer)&(this->bearer_token_auth_token_).field_2;
  (this->bearer_token_auth_token_)._M_string_length = 0;
  (this->bearer_token_auth_token_).field_2._M_local_buf[0] = '\0';
  this->keep_alive_ = false;
  this->follow_location_ = false;
  this->url_encode_ = true;
  this->address_family_ = 0;
  this->tcp_nodelay_ = false;
  (this->socket_options_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->socket_options_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->socket_options_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->socket_options_).super__Function_base._M_functor + 8) = 0;
  this->compress_ = false;
  this->decompress_ = true;
  (this->interface_)._M_dataplus._M_p = (pointer)&(this->interface_).field_2;
  (this->interface_)._M_string_length = 0;
  (this->interface_).field_2._M_local_buf[0] = '\0';
  (this->proxy_host_)._M_dataplus._M_p = (pointer)&(this->proxy_host_).field_2;
  (this->proxy_host_)._M_string_length = 0;
  (this->proxy_host_).field_2._M_local_buf[0] = '\0';
  this->proxy_port_ = -1;
  (this->proxy_basic_auth_username_)._M_dataplus._M_p =
       (pointer)&(this->proxy_basic_auth_username_).field_2;
  (this->proxy_basic_auth_username_)._M_string_length = 0;
  (this->proxy_basic_auth_username_).field_2._M_local_buf[0] = '\0';
  (this->proxy_basic_auth_password_)._M_dataplus._M_p =
       (pointer)&(this->proxy_basic_auth_password_).field_2;
  (this->proxy_basic_auth_password_)._M_string_length = 0;
  (this->proxy_basic_auth_password_).field_2._M_local_buf[0] = '\0';
  (this->proxy_bearer_token_auth_token_)._M_dataplus._M_p =
       (pointer)&(this->proxy_bearer_token_auth_token_).field_2;
  (this->proxy_bearer_token_auth_token_)._M_string_length = 0;
  (this->proxy_bearer_token_auth_token_).field_2._M_local_buf[0] = '\0';
  (this->logger_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->logger_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->logger_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->logger_).super__Function_base._M_functor + 8) = 0;
  return;
}

Assistant:

inline ClientImpl::ClientImpl(const std::string &host, int port,
                              const std::string &client_cert_path,
                              const std::string &client_key_path)
    : host_(host), port_(port),
      host_and_port_(adjust_host_string(host) + ":" + std::to_string(port)),
      client_cert_path_(client_cert_path), client_key_path_(client_key_path) {}